

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_collection_size_test.cc
# Opt level: O3

int main(void)

{
  pointer pcVar1;
  pointer pNVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  int iVar7;
  pointer __x;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  trees_collection;
  string file_path;
  Node<label::StringLabel> t;
  BracketNotationParser<label::StringLabel> bnp;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> local_168
  ;
  string local_148;
  undefined1 local_128 [24];
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  BracketNotationParser<label::StringLabel> local_f0;
  
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"parser_collection_size_test_data.txt","");
  local_168.
  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parser::BracketNotationParser<label::StringLabel>::BracketNotationParser(&local_f0);
  parser::BracketNotationParser<label::StringLabel>::parse_collection
            (&local_f0,&local_168,&local_148);
  pNVar2 = local_168.
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = (int)((ulong)((long)local_168.
                              super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_168.
                             super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249;
  if (local_168.
      super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_168.
      super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar7 = 0;
    if (iVar3 == 3) goto LAB_00102540;
LAB_001025a3:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Incorrect number of trees in collection: ",0x29);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," instead of ",0xc);
    plVar6 = (long *)std::ostream::operator<<(poVar5,3);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  }
  else {
    iVar7 = 0;
    __x = local_168.
          super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
      ::vector((vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                *)local_128,&__x->children_);
      pcVar1 = (__x->label_).label_._M_dataplus._M_p;
      local_110._M_p = (pointer)&local_100;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar1,pcVar1 + (__x->label_).label_._M_string_length);
      iVar4 = node::Node<label::StringLabel>::get_tree_size((Node<label::StringLabel> *)local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_p != &local_100) {
        operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
      }
      iVar7 = iVar7 + iVar4;
      std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
      ::~vector((vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                 *)local_128);
      __x = __x + 1;
    } while (__x != pNVar2);
    if (iVar3 != 3) goto LAB_001025a3;
    iVar3 = 0;
    if (iVar7 == 0x22) goto LAB_0010261e;
LAB_00102540:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Incorrect number of nodes in collection: ",0x29);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," instead of ",0xc);
    plVar6 = (long *)std::ostream::operator<<(poVar5,0x22);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  }
  std::ostream::put((char)plVar6);
  iVar3 = -1;
  std::ostream::flush();
LAB_0010261e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.kMatchRightBracket._M_dataplus._M_p != &local_f0.kMatchRightBracket.field_2) {
    operator_delete(local_f0.kMatchRightBracket._M_dataplus._M_p,
                    local_f0.kMatchRightBracket.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.kMatchLeftBracket._M_dataplus._M_p != &local_f0.kMatchLeftBracket.field_2) {
    operator_delete(local_f0.kMatchLeftBracket._M_dataplus._M_p,
                    local_f0.kMatchLeftBracket.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.kStructureElements._M_dataplus._M_p != &local_f0.kStructureElements.field_2) {
    operator_delete(local_f0.kStructureElements._M_dataplus._M_p,
                    local_f0.kStructureElements.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.kRightBracket._M_dataplus._M_p != &local_f0.kRightBracket.field_2) {
    operator_delete(local_f0.kRightBracket._M_dataplus._M_p,
                    local_f0.kRightBracket.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.kLeftBracket._M_dataplus._M_p != &local_f0.kLeftBracket.field_2) {
    operator_delete(local_f0.kLeftBracket._M_dataplus._M_p,
                    local_f0.kLeftBracket.field_2._M_allocated_capacity + 1);
  }
  if (local_f0.node_stack.
      super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.node_stack.
                    super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.node_stack.
                          super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.node_stack.
                          super__Vector_base<std::reference_wrapper<node::Node<label::StringLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::StringLabel>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
  ~vector(&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  return iVar3;
}

Assistant:

int main() {
  using Label = label::StringLabel;

  // Correct result - currently hard-coded here.
  int correct_number_trees = 3;
  int correct_number_nodes = 1 + 13 + 20;

  std::string file_path = "parser_collection_size_test_data.txt";

  // Create the container to store all trees.
  std::vector<node::Node<Label>> trees_collection;

  parser::BracketNotationParser<Label> bnp;
  bnp.parse_collection(trees_collection, file_path);

  int computed_number_trees = trees_collection.size();
  int computed_number_nodes = 0;
  for (auto t : trees_collection) {
    computed_number_nodes += t.get_tree_size();
  }

  if (correct_number_trees != computed_number_trees) {
    std::cerr << "Incorrect number of trees in collection: " << computed_number_trees << " instead of " << correct_number_trees << std::endl;
    return -1;
  }

  if (correct_number_nodes != computed_number_nodes) {
    std::cerr << "Incorrect number of nodes in collection: " << computed_number_nodes << " instead of " << correct_number_nodes << std::endl;
    return -1;
  }

  return 0;
}